

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O1

char * __thiscall TreeModel::index(TreeModel *this,char *__s,int __c)

{
  char cVar1;
  TreeItem *pTVar2;
  uint in_ECX;
  uint *puVar3;
  uint *in_R8;
  
  cVar1 = QAbstractItemModel::hasIndex((int)__s,__c,(QModelIndex *)(ulong)in_ECX);
  if (cVar1 == '\0') {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    this->rootItem = (TreeItem *)0x0;
  }
  else {
    puVar3 = in_R8 + 2;
    if (*(long *)(in_R8 + 4) == 0) {
      puVar3 = (uint *)(__s + 0x10);
    }
    if ((int)(in_R8[1] | *in_R8) < 0) {
      puVar3 = (uint *)(__s + 0x10);
    }
    pTVar2 = TreeItem::child(*(TreeItem **)puVar3,__c);
    if (pTVar2 == (TreeItem *)0x0) {
      *(undefined8 *)this = 0xffffffffffffffff;
      *(undefined8 *)&this->field_0x8 = 0;
      this->rootItem = (TreeItem *)0x0;
    }
    else {
      *(int *)this = __c;
      *(uint *)&this->field_0x4 = in_ECX;
      *(TreeItem **)&this->field_0x8 = pTVar2;
      this->rootItem = (TreeItem *)__s;
    }
  }
  return (char *)this;
}

Assistant:

UModelIndex TreeModel::index(int row, int column, const UModelIndex &parent) const
{
    if (!hasIndex(row, column, parent))
        return UModelIndex();
    
    TreeItem *parentItem;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
        parentItem = static_cast<TreeItem*>(parent.internalPointer());
    
    TreeItem *childItem = parentItem->child(row);
    if (childItem)
        return createIndex(row, column, childItem);
    else
        return UModelIndex();
}